

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O2

int __thiscall
DPhased::PhaseHelper(DPhased *this,sector_t *sector,int index,int light,sector_t *prev)

{
  int iVar1;
  DPhased *this_00;
  sector_t_conflict *sector_00;
  
  iVar1 = index;
  if ((sector != (sector_t *)0x0) && (sector->validcount != validcount)) {
    if (sector->lightlevel != 0) {
      light = (int)sector->lightlevel;
    }
    sector->validcount = validcount;
    if (index == 0) {
      this->m_BaseLevel = (BYTE)light;
      this_00 = this;
    }
    else {
      this_00 = (DPhased *)DObject::operator_new(0x48);
      DPhased(this_00,sector,light);
    }
    sector_00 = sector_t::NextSpecialSector
                          (sector,(sector->special == 3) + 3,(sector_t_conflict *)prev);
    iVar1 = PhaseHelper(this,(sector_t *)sector_00,index + 1,(uint)this_00->m_BaseLevel,sector);
    this_00->m_Phase = (BYTE)(((~index + iVar1) * 0x40) / iVar1);
    sector->special = 0;
  }
  return iVar1;
}

Assistant:

int DPhased::PhaseHelper (sector_t *sector, int index, int light, sector_t *prev)
{
	if (!sector || sector->validcount == validcount)
	{
		return index;
	}
	else
	{
		DPhased *l;
		int baselevel = sector->lightlevel ? sector->lightlevel : light;
		sector->validcount = validcount;

		if (index == 0)
		{
			l = this;
			m_BaseLevel = baselevel;
		}
		else
			l = new DPhased (sector, baselevel);

		int numsteps = PhaseHelper (sector->NextSpecialSector (
				sector->special == LightSequenceSpecial1 ?
					LightSequenceSpecial2 : LightSequenceSpecial1, prev),
				index + 1, l->m_BaseLevel, sector);
		l->m_Phase = ((numsteps - index - 1) * 64) / numsteps;

		sector->special = 0;

		return numsteps;
	}
}